

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

int refs_modify(refs_table_t *tbl,uint64_t a,int dir)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  long lVar3;
  int iVar4;
  uint64_t count;
  int i;
  int res;
  uint64_t new_v;
  uint64_t v;
  uint64_t *ts_bucket;
  uint64_t *bucket;
  int dir_local;
  uint64_t a_local;
  refs_table_t *tbl_local;
  
  refs_enter(tbl);
  do {
    puVar1 = tbl->refs_table;
    uVar2 = sylvan_fnvhash8(a,0xcbf29ce484222325);
    ts_bucket = puVar1 + (uVar2 & tbl->refs_size - 1);
    v = 0;
    count._0_4_ = 0x80;
    while (iVar4 = (int)count + -1, (int)count != 0) {
      while (new_v = *ts_bucket, new_v != 0x7fffffffffffffff) {
        if (new_v == 0) {
          count._4_4_ = 0;
          if (dir < 0) goto LAB_00127261;
          if (v != 0) {
            ts_bucket = (uint64_t *)v;
            v = 0;
            new_v = 0x7fffffffffffffff;
          }
          _i = a | 0x10000000000;
        }
        else {
          if ((new_v & 0xffffffffff) != a) goto LAB_0012710c;
          count._4_4_ = 1;
          if (new_v >> 0x28 == 0x7fffff) goto LAB_00127261;
          lVar3 = (long)dir + (new_v >> 0x28);
          if (lVar3 == 0) {
            _i = 0x7fffffffffffffff;
          }
          else {
            _i = a | lVar3 << 0x28;
          }
        }
        LOCK();
        uVar2 = *ts_bucket;
        if (new_v == uVar2) {
          *ts_bucket = _i;
        }
        UNLOCK();
        if (new_v == uVar2) goto LAB_00127261;
      }
      if (v == 0) {
        v = (uint64_t)ts_bucket;
      }
LAB_0012710c:
      ts_bucket = ts_bucket + 1;
      count._0_4_ = iVar4;
      if (ts_bucket == tbl->refs_table + tbl->refs_size) {
        ts_bucket = tbl->refs_table;
      }
    }
    if (dir < 0) {
      count._4_4_ = 0;
      goto LAB_00127261;
    }
    if (v == 0) {
      refs_leave(tbl);
      refs_resize(tbl);
      iVar4 = refs_modify(tbl,a,dir);
      return iVar4;
    }
    LOCK();
    lVar3 = *(long *)v;
    if (lVar3 == 0x7fffffffffffffff) {
      *(uint64_t *)v = a | 0x10000000000;
    }
    UNLOCK();
    if (lVar3 == 0x7fffffffffffffff) {
      count._4_4_ = 1;
LAB_00127261:
      refs_leave(tbl);
      return count._4_4_;
    }
  } while( true );
}

Assistant:

static inline int
refs_modify(refs_table_t *tbl, const uint64_t a, const int dir)
{
    _Atomic(uint64_t)* bucket;
    _Atomic(uint64_t)* ts_bucket;
    uint64_t v, new_v;
    int res, i;

    refs_enter(tbl);

ref_retry:
    bucket = tbl->refs_table + (fnvhash8(a) & (tbl->refs_size - 1));
    ts_bucket = NULL; // tombstone
    i = 128; // try 128 times linear probing

    while (i--) {
ref_restart:
        v = *bucket;
        if (v == refs_ts) {
            if (ts_bucket == NULL) ts_bucket = bucket;
        } else if (v == 0) {
            // not found
            res = 0;
            if (dir < 0) goto ref_exit;
            if (ts_bucket != NULL) {
                bucket = ts_bucket;
                ts_bucket = NULL;
                v = refs_ts;
            }
            new_v = a | (1ULL << 40);
            goto ref_mod;
        } else if ((v & 0x000000ffffffffff) == a) {
            // found
            res = 1;
            uint64_t count = v >> 40;
            if (count == 0x7fffff) goto ref_exit;
            count += dir;
            if (count == 0) new_v = refs_ts;
            else new_v = a | (count << 40);
            goto ref_mod;
        }

        if (++bucket == tbl->refs_table + tbl->refs_size) bucket = tbl->refs_table;
    }

    // not found after linear probing
    if (dir < 0) {
        res = 0;
        goto ref_exit;
    } else if (ts_bucket != NULL) {
        bucket = ts_bucket;
        ts_bucket = NULL;
        v = refs_ts;
        new_v = a | (1ULL << 40);
        if (!atomic_compare_exchange_weak(bucket, &v, new_v)) goto ref_retry;
        res = 1;
        goto ref_exit;
    } else {
        // hash table full
        refs_leave(tbl);
        refs_resize(tbl);
        return refs_modify(tbl, a, dir);
    }

ref_mod:
    if (!atomic_compare_exchange_weak(bucket, &v, new_v)) goto ref_restart;

ref_exit:
    refs_leave(tbl);
    return res;
}